

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O2

_Bool unshield_file_save_raw(Unshield *unshield,int index,char *filename)

{
  _Bool _Var1;
  void *buffer;
  FileDescriptor *file_descriptor;
  UnshieldReader *reader;
  uint64_t uVar2;
  void *pvVar3;
  size_t sVar4;
  char *format;
  int line;
  size_t size;
  uint uVar5;
  
  buffer = malloc(0x10000);
  if (unshield == (Unshield *)0x0) {
LAB_0010381d:
    reader = (UnshieldReader *)0x0;
  }
  else {
    file_descriptor = unshield_get_file_descriptor(unshield,index);
    if (file_descriptor == (FileDescriptor *)0x0) {
      format = "Failed to get file descriptor for file %i";
      line = 0x3cb;
LAB_00103813:
      _unshield_log(1,"unshield_file_save_raw",line,format,(ulong)(uint)index);
      goto LAB_0010381d;
    }
    if (((file_descriptor->flags & 8) != 0) || (file_descriptor->data_offset == 0))
    goto LAB_0010381d;
    if ((file_descriptor->link_flags & 1) != 0) {
      _Var1 = unshield_file_save_raw(unshield,file_descriptor->link_previous,filename);
      pvVar3 = (void *)0x0;
      reader = (UnshieldReader *)0x0;
      goto LAB_00103823;
    }
    reader = unshield_reader_create(unshield,index,file_descriptor);
    if (reader == (UnshieldReader *)0x0) {
      format = "Failed to create data reader for file %i";
      line = 0x3de;
      goto LAB_00103813;
    }
    uVar2 = unshield_fsize(unshield,reader->volume_file);
    if (uVar2 != file_descriptor->data_offset) {
      if (filename == (char *)0x0) {
        pvVar3 = (void *)0x0;
      }
      else {
        pvVar3 = (*unshield->io_callbacks->fopen)(filename,"wb",unshield->io_userdata);
        if (pvVar3 == (void *)0x0) {
          pvVar3 = (void *)0x0;
          _unshield_log(1,"unshield_file_save_raw",0x3ed,"Failed to open output file \'%s\'",
                        filename);
          _Var1 = false;
          goto LAB_00103823;
        }
      }
      uVar5 = *(uint *)(file_descriptor->md5 +
                       (ulong)(((byte)file_descriptor->flags & 4) >> 2) * 8 + -0x18);
      do {
        if (uVar5 == 0) {
          _Var1 = true;
          goto LAB_00103823;
        }
        size = 0x10000;
        if (uVar5 < 0x10000) {
          size = (size_t)uVar5;
        }
        _Var1 = unshield_reader_read(reader,buffer,size);
        if (!_Var1) {
          _Var1 = false;
          _unshield_log(1,"unshield_file_save_raw",0x401,
                        "Failed to read %i bytes from input cabinet file %i",size,
                        (ulong)file_descriptor->volume);
          goto LAB_00103823;
        }
        uVar5 = uVar5 - (int)size;
      } while ((pvVar3 == (void *)0x0) ||
              (sVar4 = (*unshield->io_callbacks->fwrite)(buffer,1,size,pvVar3,unshield->io_userdata)
              , sVar4 == size));
      _Var1 = false;
      _unshield_log(1,"unshield_file_save_raw",0x40a,"Failed to write %i bytes to file \'%s\'",size,
                    filename);
      goto LAB_00103823;
    }
    _unshield_log(1,"unshield_file_save_raw",0x3e4,"File %i is not inside the cabinet.",
                  (ulong)(uint)index);
  }
  pvVar3 = (void *)0x0;
  _Var1 = false;
LAB_00103823:
  unshield_reader_destroy(reader);
  if (pvVar3 != (void *)0x0) {
    (*unshield->io_callbacks->fclose)(pvVar3,unshield->io_userdata);
  }
  free(buffer);
  return _Var1;
}

Assistant:

bool unshield_file_save_raw(Unshield* unshield, int index, const char* filename)
{
  /* XXX: Thou Shalt Not Cut & Paste... */
  bool success = false;
  FILE* output = NULL;
  unsigned char* input_buffer   = (unsigned char*)malloc(BUFFER_SIZE);
  unsigned char* output_buffer  = (unsigned char*)malloc(BUFFER_SIZE);
  unsigned int bytes_left;
  UnshieldReader* reader = NULL;
  FileDescriptor* file_descriptor;

  if (!unshield)
    goto exit;

  if (!(file_descriptor = unshield_get_file_descriptor(unshield, index)))
  {
    unshield_error("Failed to get file descriptor for file %i", index);
    goto exit;
  }

  if ((file_descriptor->flags & FILE_INVALID) || 0 == file_descriptor->data_offset)
  {
    /* invalid file */
    goto exit;
  }

  if (file_descriptor->link_flags & LINK_PREV)
  {
    success = unshield_file_save_raw(unshield, file_descriptor->link_previous, filename);
    goto exit;
  }

  reader = unshield_reader_create(unshield, index, file_descriptor);
  if (!reader)
  {
    unshield_error("Failed to create data reader for file %i", index);
    goto exit;
  }

  if (unshield_fsize(unshield, reader->volume_file) == (long)file_descriptor->data_offset)
  {
    unshield_error("File %i is not inside the cabinet.", index);
    goto exit;
  }

  if (filename) 
  {
    output = unshield_fopen(unshield, filename, "wb");
    if (!output)
    {
      unshield_error("Failed to open output file '%s'", filename);
      goto exit;
    }
  }

  if (file_descriptor->flags & FILE_COMPRESSED)
    bytes_left = file_descriptor->compressed_size;
  else
    bytes_left = file_descriptor->expanded_size;

  /*unshield_trace("Bytes to read: %i", bytes_left);*/

  while (bytes_left > 0)
  {
    uLong bytes_to_write = MIN(bytes_left, BUFFER_SIZE);

    if (!unshield_reader_read(reader, output_buffer, bytes_to_write))
    {
#if VERBOSE
      unshield_error("Failed to read %i bytes from input cabinet file %i", 
          bytes_to_write, file_descriptor->volume);
#endif
      goto exit;
    }

    bytes_left -= bytes_to_write;

      if (output) {
          if (bytes_to_write != unshield_fwrite(unshield, output_buffer, 1, bytes_to_write, output)) {
              unshield_error("Failed to write %i bytes to file '%s'", bytes_to_write, filename);
              goto exit;
          }
      }
  }

  success = true;
  
exit:
  unshield_reader_destroy(reader);
  FCLOSE(unshield, output);
  FREE(input_buffer);
  FREE(output_buffer);
  return success;
}